

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_layer_interface.cpp
# Opt level: O2

void AddEnvironmentApiLayers
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *enabled_layers)

{
  char *pcVar1;
  long lVar2;
  char cVar3;
  ulong uVar4;
  string layers;
  string cur_search;
  string local_50 [32];
  
  pcVar1 = getenv("XR_ENABLE_API_LAYERS");
  if (pcVar1 == (char *)0x0) {
    layers._M_dataplus._M_p = (pointer)&layers.field_2;
    layers._M_string_length = 0;
    layers.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)&layers,pcVar1,(allocator *)&cur_search);
  }
  uVar4 = 0;
  cVar3 = (char)&layers;
  lVar2 = std::__cxx11::string::find(cVar3,0x3a);
  cur_search._M_dataplus._M_p = (pointer)&cur_search.field_2;
  cur_search._M_string_length = 0;
  cur_search.field_2._M_local_buf[0] = '\0';
  while (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)&layers);
    std::__cxx11::string::operator=((string *)&cur_search,local_50);
    std::__cxx11::string::~string(local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(enabled_layers,&cur_search);
    uVar4 = lVar2 + 1;
    lVar2 = std::__cxx11::string::find(cVar3,0x3a);
  }
  if (uVar4 < layers._M_string_length) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)&layers);
    std::__cxx11::string::operator=((string *)&cur_search,local_50);
    std::__cxx11::string::~string(local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(enabled_layers,&cur_search);
  }
  std::__cxx11::string::~string((string *)&cur_search);
  std::__cxx11::string::~string((string *)&layers);
  return;
}

Assistant:

static void AddEnvironmentApiLayers(std::vector<std::string>& enabled_layers) {
    std::string layers = PlatformUtilsGetEnv(OPENXR_ENABLE_LAYERS_ENV_VAR);

    std::size_t last_found = 0;
    std::size_t found = layers.find_first_of(PATH_SEPARATOR);
    std::string cur_search;

    // Handle any path listings in the string (separated by the appropriate path separator)
    while (found != std::string::npos) {
        cur_search = layers.substr(last_found, found - last_found);
        enabled_layers.push_back(cur_search);
        last_found = found + 1;
        found = layers.find_first_of(PATH_SEPARATOR, last_found);
    }

    // If there's something remaining in the string, copy it over
    if (last_found < layers.size()) {
        cur_search = layers.substr(last_found);
        enabled_layers.push_back(cur_search);
    }
}